

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exported_table_data.cpp
# Opt level: O2

void __thiscall
duckdb::ExportedTableInfo::ExportedTableInfo
          (ExportedTableInfo *this,ClientContext *context,ExportedTableData *table_data_p)

{
  TableCatalogEntry *pTVar1;
  
  pTVar1 = GetEntry(context,table_data_p);
  this->entry = pTVar1;
  ExportedTableData::ExportedTableData(&this->table_data,table_data_p);
  return;
}

Assistant:

ExportedTableInfo::ExportedTableInfo(ClientContext &context, ExportedTableData table_data_p)
    : entry(GetEntry(context, table_data_p)), table_data(std::move(table_data_p)) {
}